

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O0

ZyanStatus
ZydisFormatterATTFormatOperandMEM
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanStatus ZVar1;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  ZyanStatus status_047620348_16;
  ZyanStatus status_047620348_15;
  ZyanStatus status_047620348_14;
  ZyanStatus status_047620348_13;
  ZyanStatus status_047620348_12;
  ZyanStatus status_047620348_11;
  ZyanStatus status_047620348_10;
  ZyanStatus status_047620348_9;
  ZyanStatus status_047620348_8;
  ZyanStatus status_047620348_7;
  ZyanStatus status_047620348_6;
  ZyanStatus status_047620348_5;
  ZyanStatus status_047620348_4;
  ZyanStatus status_047620348_3;
  ZyanStatus status_047620348_2;
  ZyanBool neither_reg_nor_idx;
  ZyanBool should_print_idx;
  ZyanBool should_print_reg;
  ZyanStatus status_047620348_1;
  ZyanBool absolute;
  ZyanStatus status_047620348;
  ZydisFormatterContext *context_local;
  ZydisFormatterBuffer *buffer_local;
  ZydisFormatter *formatter_local;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0xcb,
                  "ZyanStatus ZydisFormatterATTFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0xcc,
                  "ZyanStatus ZydisFormatterATTFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0xcd,
                  "ZyanStatus ZydisFormatterATTFormatOperandMEM(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  ZVar1 = (*formatter->func_print_segment)(formatter,buffer,context);
  if ((ZVar1 & 0x80000000) != 0) {
    return ZVar1;
  }
  bVar3 = false;
  if (formatter->force_relative_riprel == '\0') {
    bVar3 = context->runtime_address != 0xffffffffffffffff;
  }
  if ((((bVar3) && (*(char *)((long)&context->operand->field_10 + 0x21) != '\0')) &&
      ((context->operand->field_10).mem.index == ZYDIS_REGISTER_NONE)) &&
     ((((context->operand->field_10).mem.base == ZYDIS_REGISTER_NONE ||
       ((context->operand->field_10).mem.base == ZYDIS_REGISTER_EIP)) ||
      ((context->operand->field_10).mem.base == ZYDIS_REGISTER_RIP)))) {
    ZVar1 = (*formatter->func_print_address_abs)(formatter,buffer,context);
    if ((ZVar1 & 0x80000000) != 0) {
      return ZVar1;
    }
    return 0x100000;
  }
  bVar3 = (context->operand->field_10).mem.base != ZYDIS_REGISTER_NONE;
  bVar4 = (context->operand->field_10).mem.index != ZYDIS_REGISTER_NONE;
  if (bVar3 || bVar4) {
    if ((*(char *)((long)&context->operand->field_10 + 0x21) == '\0') ||
       ((context->operand->field_10).mem.disp.value == 0)) goto LAB_0011e392;
    uVar2 = (*formatter->func_print_disp)(formatter,buffer,context);
  }
  else {
    uVar2 = (*formatter->func_print_address_abs)(formatter,buffer,context);
  }
  if ((uVar2 & 0x80000000) != 0) {
    return uVar2;
  }
LAB_0011e392:
  if (bVar3 || bVar4) {
    if (buffer->is_token_list == '\0') {
      formatter_local._4_4_ = ZydisStringAppendShort(&buffer->string,&STR_MEMORY_BEGIN_ATT);
    }
    else {
      formatter_local._4_4_ =
           ZydisFormatterBufferAppendPredefined
                     (buffer,(ZydisPredefinedToken *)&TOK_DATA_MEMORY_BEGIN_ATT);
    }
    if (((formatter_local._4_4_ & 0x80000000) == 0) &&
       ((!bVar3 ||
        (formatter_local._4_4_ =
              (*formatter->func_print_register)
                        (formatter,buffer,context,(context->operand->field_10).mem.base),
        (formatter_local._4_4_ & 0x80000000) == 0)))) {
      if (bVar4) {
        if (buffer->is_token_list == '\0') {
          uVar2 = ZydisStringAppendShort(&buffer->string,&STR_DELIM_MEMORY);
        }
        else {
          uVar2 = ZydisFormatterBufferAppendPredefined
                            (buffer,(ZydisPredefinedToken *)&TOK_DATA_DELIM_MEMORY);
        }
        if ((uVar2 & 0x80000000) != 0) {
          return uVar2;
        }
        ZVar1 = (*formatter->func_print_register)
                          (formatter,buffer,context,(context->operand->field_10).mem.index);
        if ((ZVar1 & 0x80000000) != 0) {
          return ZVar1;
        }
        if ((((context->operand->field_10).mem.scale != '\0') &&
            ((context->operand->field_10).mem.type != ZYDIS_MEMOP_TYPE_MIB)) &&
           ((1 < (context->operand->field_10).mem.scale || (formatter->force_memory_scale != '\0')))
           ) {
          if ((buffer->is_token_list != '\0') &&
             (ZVar1 = ZydisFormatterBufferAppend(buffer,'\x02'), (ZVar1 & 0x80000000) != 0)) {
            return ZVar1;
          }
          if (buffer->is_token_list == '\0') {
            uVar2 = ZydisStringAppendShort(&buffer->string,&STR_DELIM_MEMORY);
          }
          else {
            uVar2 = ZydisFormatterBufferAppendPredefined
                              (buffer,(ZydisPredefinedToken *)&TOK_DATA_DELIM_MEMORY);
          }
          if ((uVar2 & 0x80000000) != 0) {
            return uVar2;
          }
          if ((buffer->is_token_list != '\0') &&
             (ZVar1 = ZydisFormatterBufferAppend(buffer,'\v'), (ZVar1 & 0x80000000) != 0)) {
            return ZVar1;
          }
          ZVar1 = ZydisStringAppendDecU
                            (&buffer->string,(ulong)(context->operand->field_10).mem.scale,'\0',
                             (ZyanStringView *)0x0,(ZyanStringView *)0x0);
          if ((ZVar1 & 0x80000000) != 0) {
            return ZVar1;
          }
        }
      }
      if (buffer->is_token_list == '\0') {
        formatter_local._4_4_ = ZydisStringAppendShort(&buffer->string,&STR_MEMORY_END_ATT);
      }
      else {
        formatter_local._4_4_ =
             ZydisFormatterBufferAppendPredefined
                       (buffer,(ZydisPredefinedToken *)&TOK_DATA_MEMORY_END_ATT);
      }
      if ((formatter_local._4_4_ & 0x80000000) == 0) {
        formatter_local._4_4_ = 0x100000;
      }
    }
  }
  else {
    formatter_local._4_4_ = 0x100000;
  }
  return formatter_local._4_4_;
}

Assistant:

ZyanStatus ZydisFormatterATTFormatOperandMEM(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZYAN_CHECK(formatter->func_print_segment(formatter, buffer, context));

    const ZyanBool absolute = !formatter->force_relative_riprel &&
        (context->runtime_address != ZYDIS_RUNTIME_ADDRESS_NONE);
    if (absolute && context->operand->mem.disp.size &&
        (context->operand->mem.index == ZYDIS_REGISTER_NONE) &&
       ((context->operand->mem.base  == ZYDIS_REGISTER_NONE) ||
        (context->operand->mem.base  == ZYDIS_REGISTER_EIP ) ||
        (context->operand->mem.base  == ZYDIS_REGISTER_RIP )))
    {
        // EIP/RIP-relative or absolute-displacement address operand
        ZYAN_CHECK(formatter->func_print_address_abs(formatter, buffer, context));
    } else
    {
        const ZyanBool should_print_reg = context->operand->mem.base != ZYDIS_REGISTER_NONE;
        const ZyanBool should_print_idx = context->operand->mem.index != ZYDIS_REGISTER_NONE;
        const ZyanBool neither_reg_nor_idx = !should_print_reg && !should_print_idx;

        // Regular memory operand
        if (neither_reg_nor_idx)
        {
            ZYAN_CHECK(formatter->func_print_address_abs(formatter, buffer, context));
        } else if (context->operand->mem.disp.size && context->operand->mem.disp.value)
        {
            ZYAN_CHECK(formatter->func_print_disp(formatter, buffer, context));
        }

        if (neither_reg_nor_idx)
        {
            return ZYAN_STATUS_SUCCESS;
        }

        ZYDIS_BUFFER_APPEND(buffer, MEMORY_BEGIN_ATT);

        if (should_print_reg)
        {
            ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                context->operand->mem.base));
        }
        if (should_print_idx)
        {
            ZYDIS_BUFFER_APPEND(buffer, DELIM_MEMORY);
            ZYAN_CHECK(formatter->func_print_register(formatter, buffer, context,
                context->operand->mem.index));
            if (context->operand->mem.scale &&
                (context->operand->mem.type != ZYDIS_MEMOP_TYPE_MIB) &&
                ((context->operand->mem.scale > 1) || formatter->force_memory_scale))
            {
                ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DELIMITER);
                ZYDIS_BUFFER_APPEND(buffer, DELIM_MEMORY);
                ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_IMMEDIATE);
                ZYAN_CHECK(ZydisStringAppendDecU(&buffer->string, context->operand->mem.scale, 0,
                    ZYAN_NULL, ZYAN_NULL));
            }
        }

        ZYDIS_BUFFER_APPEND(buffer, MEMORY_END_ATT);
        return ZYAN_STATUS_SUCCESS;
    }

    return ZYAN_STATUS_SUCCESS;
}